

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O3

void __thiscall miniros::master::Master::setResolveNodeIP(Master *this,bool resolv)

{
  string local_70;
  string local_50;
  RpcValue local_30;
  
  MasterHandler::setResolveNodeIP(&this->m_handler,resolv);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"master","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/resolve_ip","");
  local_30._type = TypeBoolean;
  local_30._value.asBool = resolv;
  ParameterStorage::setParam(&this->m_parameterStorage,&local_50,&local_70,&local_30);
  XmlRpc::XmlRpcValue::invalidate(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Master::setResolveNodeIP(bool resolv)
{
  m_handler.setResolveNodeIP(resolv);
  m_parameterStorage.setParam("master", "/resolve_ip", resolv);
}